

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_blockwise.hpp
# Opt level: O3

vector<long,_std::allocator<long>_> * __thiscall
utility::detail::
generate_block_bounds<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,detail *this,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *generator,
          size_t block_size,size_t range_length,int64_t min,int64_t max)

{
  ulong uVar1;
  long lVar2;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar3;
  result_type_conflict1 __x;
  initializer_list<long> __l;
  vector<long,_std::allocator<long>_> local_c8;
  vector<long,_std::allocator<long>_> *local_b0;
  long local_a8;
  longlong local_a0;
  double local_98;
  double local_90;
  detail *local_88;
  int64_t local_80;
  urd_order_statistic_distribution<double> local_78;
  double local_48;
  double dStack_40;
  
  __l._M_len = 1;
  __l._M_array = (iterator)&local_78;
  local_b0 = __return_storage_ptr__;
  local_a8 = min;
  local_88 = this;
  local_80 = min;
  local_78.m_param.m_n = range_length;
  std::vector<long,_std::allocator<long>_>::vector(&local_c8,__l,(allocator_type *)&local_a0);
  lVar2 = (block_size / (ulong)generator + 1) - (ulong)(block_size % (ulong)generator == 0);
  if (lVar2 != 1) {
    local_90 = (double)(long)range_length;
    local_98 = (double)local_a8;
    uVar1 = 0;
    local_48 = 0.0;
    dStack_40 = 1.0;
    plVar3 = generator;
    do {
      local_78.m_param.m_a = local_90;
      local_78.m_param.m_b = local_98;
      local_78.m_uniform._M_param._M_a = local_48;
      local_78.m_uniform._M_param._M_b = dStack_40;
      local_78.m_param.m_n = block_size;
      local_78.m_param.m_k = (size_t)plVar3;
      __x = urd_order_statistic_distribution<double>::operator()
                      (&local_78,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       local_88,&local_78.m_param);
      local_a0 = llround(__x);
      if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_a0);
      }
      else {
        *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_a0;
        local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar1 = uVar1 + 1;
      plVar3 = (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               ((long)&generator->_M_x + (long)&plVar3->_M_x);
    } while (uVar1 < lVar2 - 1U);
  }
  if (local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_80);
  }
  else {
    *local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
     _M_finish = local_a8;
    local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  (local_b0->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_start = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (local_b0->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_finish = local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (local_b0->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  return local_b0;
}

Assistant:

auto
            generate_block_bounds
            (
                URNG && generator,
                std::size_t block_size,
                std::size_t range_length,
                std::int64_t min,
                std::int64_t max
            )
        {
            const auto n = range_length;
            auto bounds = std::vector<std::int64_t>{min};

            const auto remainder = range_length % block_size;
            const auto block_count =
                range_length / block_size + static_cast<std::size_t>(remainder != 0);
            for (auto i = 0ul; i < block_count - 1; ++i)
            {
                const auto k = (i + 1) * block_size;

                auto osd =
                    utility::urd_order_statistic_distribution<double>
                    (
                        n,
                        k,
                        static_cast<double>(min),
                        static_cast<double>(max)
                    );
                const auto kth_stat = std::llround(osd(generator));

                bounds.push_back(kth_stat);
            }
            bounds.push_back(max);

            return bounds;
        }